

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfArguments.c
# Opt level: O2

void sbfArguments_destroy(sbfArguments a)

{
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0x20; lVar1 != 0x11f; lVar1 = lVar1 + 1) {
    free(*(void **)(a->mOptions + lVar1 * 8));
  }
  for (uVar2 = 0; uVar2 < a->mArgumentsSize; uVar2 = uVar2 + 1) {
    free(a->mArguments[uVar2]);
  }
  free(a->mArguments);
  free(a);
  return;
}

Assistant:

void
sbfArguments_destroy (sbfArguments a)
{
    u_int i;

    for (i = 0; i < SBF_ARRAYSIZE (a->mOptions); i++)
        free ((void*)a->mValues[i]);

    for (i = 0; i < a->mArgumentsSize; i++)
        free ((void*)a->mArguments[i]);
    free (a->mArguments);

    free (a);
}